

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FullPivHouseholderQR.h
# Opt level: O2

void __thiscall
Eigen::FullPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
FullPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (FullPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *matrix)

{
  long *plVar1;
  long local_48;
  long local_40;
  FullPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_38;
  
  local_48 = *(long *)(matrix + 8);
  local_40 = *(long *)(matrix + 0x10);
  Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)this,&local_48,&local_40);
  local_38 = this + 0x18;
  local_48 = *(long *)(matrix + 8);
  local_40 = *(long *)(matrix + 0x10);
  plVar1 = &local_48;
  if (local_40 < local_48) {
    plVar1 = &local_40;
  }
  Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>((Matrix<double,__1,_1,_0,__1,_1> *)local_38,plVar1);
  local_48 = *(long *)(matrix + 8);
  local_40 = *(long *)(matrix + 0x10);
  plVar1 = &local_48;
  if (local_40 < local_48) {
    plVar1 = &local_40;
  }
  Matrix<long,_1,_-1,_1,_1,_-1>::Matrix<long>((Matrix<long,_1,__1,_1,_1,__1> *)(this + 0x28),plVar1)
  ;
  local_48 = *(long *)(matrix + 8);
  local_40 = *(long *)(matrix + 0x10);
  plVar1 = &local_48;
  if (local_40 < local_48) {
    plVar1 = &local_40;
  }
  Matrix<long,_1,_-1,_1,_1,_-1>::Matrix<long>((Matrix<long,_1,__1,_1,_1,__1> *)(this + 0x38),plVar1)
  ;
  PermutationMatrix<-1,_-1,_int>::PermutationMatrix
            ((PermutationMatrix<_1,__1,_int> *)(this + 0x48),*(Index *)(matrix + 0x10));
  local_48 = *(long *)(matrix + 0x10);
  Matrix<double,_1,_-1,_1,_1,_-1>::Matrix<long>
            ((Matrix<double,_1,__1,_1,_1,__1> *)(this + 0x58),&local_48);
  *(undefined2 *)(this + 0x68) = 0;
  compute<Eigen::Matrix<double,_1,_1,0,_1,_1>>(this,matrix);
  return;
}

Assistant:

explicit FullPivHouseholderQR(const EigenBase<InputType>& matrix)
      : m_qr(matrix.rows(), matrix.cols()),
        m_hCoeffs((std::min)(matrix.rows(), matrix.cols())),
        m_rows_transpositions((std::min)(matrix.rows(), matrix.cols())),
        m_cols_transpositions((std::min)(matrix.rows(), matrix.cols())),
        m_cols_permutation(matrix.cols()),
        m_temp(matrix.cols()),
        m_isInitialized(false),
        m_usePrescribedThreshold(false)
    {
      compute(matrix.derived());
    }